

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall CVmObjBigNum::alloc_bignum(CVmObjBigNum *this,size_t digits)

{
  int iVar1;
  CVmVarHeap *ext;
  size_t sVar2;
  undefined4 extraout_var;
  size_t in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  ext = CVmMemory::get_var_heap(G_mem_X);
  sVar2 = calc_alloc(in_RSI);
  iVar1 = (*ext->_vptr_CVmVarHeap[4])(ext,sVar2,in_RDI);
  *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  set_prec((char *)ext,in_stack_ffffffffffffffd8);
  set_int_val((char *)ext,in_stack_ffffffffffffffd8);
  *(undefined1 *)(*(long *)(in_RDI + 8) + 4) = 0;
  return;
}

Assistant:

void CVmObjBigNum::alloc_bignum(VMG_ size_t digits)
{
    /* allocate space for the given number of elements */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(calc_alloc(digits), this);

    /* set the precision */
    set_prec(ext_, digits);

    /* initialize the value to zero */
    set_int_val(ext_, 0);

    /* clear the flags */
    ext_[VMBN_FLAGS] = 0;
}